

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_resolver.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::java::anon_unknown_0::MessageHasConflictingClassName
          (anon_unknown_0 *this,Descriptor *message,string_view classname,NameEquality equality_mode
          )

{
  bool bVar1;
  NameEquality NVar2;
  Descriptor *pDVar3;
  EnumDescriptor *pEVar4;
  NameEquality NVar5;
  char *pcVar6;
  bool bVar7;
  int iVar8;
  string_view b;
  string_view classname_00;
  string_view classname_01;
  string_view b_00;
  string_view b_01;
  string_view a;
  string_view a_00;
  string_view a_01;
  
  pcVar6 = (char *)classname._M_len;
  NVar5 = (NameEquality)classname._M_str;
  b._M_str = pcVar6;
  b._M_len = (size_t)message;
  a._M_str = (char *)**(undefined8 **)(this + 8);
  a._M_len = (*(undefined8 **)(this + 8))[1];
  NVar2 = CheckNameEquality(a,b);
  bVar7 = true;
  if (NVar2 != NVar5) {
    bVar7 = 0 < *(int *)(this + 0x80);
    if (0 < *(int *)(this + 0x80)) {
      pDVar3 = Descriptor::nested_type((Descriptor *)this,0);
      classname_00._M_str._4_4_ = 0;
      classname_00._0_12_ = classname._0_12_;
      bVar1 = MessageHasConflictingClassName
                        ((anon_unknown_0 *)pDVar3,message,classname_00,equality_mode);
      if (!bVar1) {
        iVar8 = 1;
        do {
          bVar7 = iVar8 < *(int *)(this + 0x80);
          if (*(int *)(this + 0x80) <= iVar8) goto LAB_002b7f55;
          pDVar3 = Descriptor::nested_type((Descriptor *)this,iVar8);
          classname_01._M_str._4_4_ = 0;
          classname_01._0_12_ = classname._0_12_;
          bVar1 = MessageHasConflictingClassName
                            ((anon_unknown_0 *)pDVar3,message,classname_01,equality_mode);
          iVar8 = iVar8 + 1;
        } while (!bVar1);
      }
      if (bVar7) {
        return true;
      }
    }
LAB_002b7f55:
    bVar7 = 0 < *(int *)(this + 0x84);
    if (0 < *(int *)(this + 0x84)) {
      pEVar4 = Descriptor::enum_type((Descriptor *)this,0);
      b_00._M_str = pcVar6;
      b_00._M_len = (size_t)message;
      a_00._M_str = (char *)**(undefined8 **)(pEVar4 + 8);
      a_00._M_len = (*(undefined8 **)(pEVar4 + 8))[1];
      NVar2 = CheckNameEquality(a_00,b_00);
      if (NVar2 != NVar5) {
        iVar8 = 1;
        do {
          bVar7 = iVar8 < *(int *)(this + 0x84);
          if (*(int *)(this + 0x84) <= iVar8) {
            return bVar7;
          }
          pEVar4 = Descriptor::enum_type((Descriptor *)this,iVar8);
          b_01._M_str = pcVar6;
          b_01._M_len = (size_t)message;
          a_01._M_str = (char *)**(undefined8 **)(pEVar4 + 8);
          a_01._M_len = (*(undefined8 **)(pEVar4 + 8))[1];
          NVar2 = CheckNameEquality(a_01,b_01);
          iVar8 = iVar8 + 1;
        } while (NVar2 != NVar5);
      }
    }
  }
  return bVar7;
}

Assistant:

bool MessageHasConflictingClassName(const Descriptor* message,
                                    absl::string_view classname,
                                    NameEquality equality_mode) {
  if (CheckNameEquality(message->name(), classname) == equality_mode) {
    return true;
  }
  for (int i = 0; i < message->nested_type_count(); ++i) {
    if (MessageHasConflictingClassName(message->nested_type(i), classname,
                                       equality_mode)) {
      return true;
    }
  }
  for (int i = 0; i < message->enum_type_count(); ++i) {
    if (CheckNameEquality(message->enum_type(i)->name(), classname) ==
        equality_mode) {
      return true;
    }
  }
  return false;
}